

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O2

void __thiscall
ModsIRCCommand::trigger
          (ModsIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  bool bVar1;
  char cVar2;
  long lVar3;
  ulong uVar4;
  char *pcVar5;
  size_t sVar6;
  ShowModsIRCCommand *this_00;
  _Alloc_hider args_2;
  char *pcVar7;
  long *plVar8;
  uint uVar9;
  basic_string_view<char,_std::char_traits<char>_> rhs;
  string_view nick_00;
  string msg;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  undefined8 local_70;
  char *local_68;
  string_view staff_word;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar7 = nick._M_str;
  args_2._M_p = (pointer)nick._M_len;
  pcVar5 = channel._M_str;
  sVar6 = channel._M_len;
  rhs._M_str = "show";
  rhs._M_len = 4;
  this_00 = (ShowModsIRCCommand *)parameters._M_len;
  bVar1 = jessilib::equalsi<char,char>(parameters,rhs);
  if (!bVar1) {
    lVar3 = Jupiter::IRC::Client::getChannel(source,sVar6,pcVar5);
    if (lVar3 != 0) {
      Jupiter::IRC::Client::Channel::getType();
      msg._M_dataplus._M_p = (pointer)&msg.field_2;
      msg._M_string_length = 0;
      msg.field_2._M_local_buf[0] = '\0';
      staff_word._M_len = pluginInstance.m_staffTitle._M_string_length;
      staff_word._M_str = pluginInstance.m_staffTitle._M_dataplus._M_p;
      uVar9 = 0;
      while( true ) {
        RenX::getCore();
        uVar4 = RenX::Core::getServerCount();
        if (uVar4 == uVar9) break;
        uVar4 = RenX::getCore();
        lVar3 = RenX::Core::getServer(uVar4);
        cVar2 = RenX::Server::isLogChanType((int)lVar3);
        if (cVar2 != '\0') {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                    (&msg,"");
          if (*(long *)(lVar3 + 0x20) != 0) {
            plVar8 = (long *)(lVar3 + 0x10);
            while (plVar8 = (long *)*plVar8, plVar8 != (long *)(lVar3 + 0x10)) {
              if ((*(char *)(plVar8 + 0x22) == '\0') &&
                 ((plVar8[0xc] != 0 ||
                  ((*(int *)(plVar8 + 0x38) != 0 && ((plVar8[0x31] != 0 || (plVar8[0x35] != 0)))))))
                 ) {
                if (msg._M_string_length == 0) {
                  std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                            ((string *)&msg,&staff_word);
                  local_50._M_dataplus._M_p = (pointer)0xb;
                  local_50._M_string_length = 0x13c3d8;
                  std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                            ((string *)&msg,
                             (basic_string_view<char,_std::char_traits<char>_> *)&local_50);
                }
                else {
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  append(&msg,", ");
                }
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(&msg,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (plVar8 + 0x30));
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(&msg,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (plVar8 + 3));
              }
            }
          }
          if (msg._M_string_length == 0) {
            local_70 = 3;
            local_68 = "No ";
            local_80._M_len = 0xe;
            local_80._M_str = "s are in-game.";
            jessilib::
            join<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>>
                      (&local_50,(jessilib *)&local_70,&staff_word,&local_80,
                       (basic_string_view<char,_std::char_traits<char>_> *)args_2._M_p);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(&msg,&local_50);
            std::__cxx11::string::~string((string *)&local_50);
          }
          args_2._M_p = msg._M_dataplus._M_p;
          Jupiter::IRC::Client::sendMessage(source,sVar6,pcVar5,msg._M_string_length);
        }
        uVar9 = uVar9 + 1;
      }
      if (msg._M_string_length == 0) {
        Jupiter::IRC::Client::sendMessage
                  (source,sVar6,pcVar5,0x40,
                   "Error: Channel not attached to any connected Renegade X servers.");
      }
      std::__cxx11::string::~string((string *)&msg);
    }
    return;
  }
  nick_00._M_str = pcVar7;
  nick_00._M_len = (size_t)args_2._M_p;
  ShowModsIRCCommand::trigger(this_00,source,channel,nick_00,parameters);
  return;
}

Assistant:

void ModsIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	if (jessilib::equalsi(parameters, "show"sv)) {
		ShowModsIRCCommand_instance.trigger(source, channel, nick, parameters);
	}
	else {
		Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
		if (chan != nullptr) {
			int type = chan->getType();
			std::string msg;
			std::string_view staff_word = pluginInstance.getStaffTitle();
			for (unsigned int i = 0; i != RenX::getCore()->getServerCount(); i++) {
				RenX::Server *server = RenX::getCore()->getServer(i);
				if (server->isLogChanType(type)) {
					msg = "";
					if (server->players.size() != 0) {
						for (auto node = server->players.begin(); node != server->players.end(); ++node) {
							if (node->isBot == false && (!node->adminType.empty() || (node->access != 0 && (!node->gamePrefix.empty() || !node->formatNamePrefix.empty())))) {
								if (!msg.empty()) {
									msg += ", ";
								}
								else {
									msg += staff_word;
									msg += "s in-game: "sv;
								}
								msg += node->gamePrefix;
								msg += node->name;
							}
						}
					}
					if (msg.empty()) {
						msg = jessilib::join<std::string>("No "sv, staff_word, "s are in-game."sv);
					}
					source->sendMessage(channel, msg);
				}
			}
			if (msg.empty()) {
				source->sendMessage(channel,
					"Error: Channel not attached to any connected Renegade X servers."sv);
			}
		}
	}
}